

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O1

bool_t priRMTest(word *a,size_t n,size_t iter,void *stack)

{
  word *a_00;
  qr_o *r;
  ulong uVar1;
  bool_t bVar2;
  int iVar3;
  u32 seed;
  size_t sVar4;
  size_t sVar5;
  size_t n_00;
  size_t sVar6;
  size_t sVar7;
  void *stack_00;
  long lVar8;
  void *state;
  bool bVar9;
  
  sVar4 = zmCreate_keep(n * 8);
  sVar5 = prngCOMBO_keep();
  n_00 = wwWordSize(a,n);
  bVar2 = zzIsEven(a,n_00);
  if (bVar2 != 0) {
    iVar3 = wwCmpW(a,n_00,2);
    bVar9 = iVar3 == 0;
    goto LAB_0014a158;
  }
  if ((n_00 != 1) || (uVar1 = *a, 0x30 < uVar1)) {
    a_00 = (word *)((long)stack + n * 8);
    r = (qr_o *)(a_00 + n);
    state = (void *)((long)&(r->hdr).keep + sVar4);
    stack_00 = (void *)(sVar5 + (long)state);
    seed = utilNonce32();
    prngCOMBOStart(state,seed);
    u64To(a_00,n_00 << 3,a);
    sVar4 = memNonZeroSize(a_00,n_00 << 3);
    zmCreate(r,(octet *)a_00,sVar4,stack_00);
    wwCopy((word *)stack,a,n_00);
    zzSubW2((word *)stack,n_00,1);
    sVar4 = wwLoZeroBits((word *)stack,n_00);
    wwShLo((word *)stack,n_00,sVar4);
    sVar5 = wwWordSize((word *)stack,n_00);
    bVar9 = true;
    if (iter != 0) {
      do {
        iter = iter - 1;
        lVar8 = 0xf;
        while( true ) {
          bVar2 = zzRandNZMod(a_00,a,n_00,prngCOMBOStepR,state);
          if (bVar2 == 0) goto LAB_0014a156;
          bVar2 = wwEq(a_00,r->unity,n_00);
          if ((bVar2 == 0) && (bVar2 = zzIsSumEq(a,a_00,r->unity,n_00), bVar2 == 0)) break;
          lVar8 = lVar8 + -1;
          if (lVar8 == 0) goto LAB_0014a156;
        }
        qrPower(a_00,a_00,(word *)stack,sVar5,r,stack_00);
        bVar2 = wwEq(a_00,r->unity,n_00);
        if ((bVar2 == 0) && (bVar2 = zzIsSumEq(a,a_00,r->unity,n_00), bVar2 == 0)) {
          sVar6 = 1;
          sVar7 = sVar6;
          if (1 < sVar4) {
            do {
              (*r->sqr)(a_00,a_00,r,stack_00);
              bVar2 = wwEq(a_00,r->unity,n_00);
              if (bVar2 != 0) goto LAB_0014a156;
              bVar2 = zzIsSumEq(a,a_00,r->unity,n_00);
              sVar7 = sVar6;
            } while ((bVar2 == 0) && (sVar6 = sVar6 + 1, sVar7 = sVar4, sVar4 != sVar6));
          }
          if (sVar7 == sVar4) goto LAB_0014a156;
        }
      } while (iter != 0);
      bVar9 = true;
    }
    goto LAB_0014a158;
  }
  if (uVar1 == 1) {
LAB_0014a156:
    bVar9 = false;
  }
  else {
    if (uVar1 != 3) {
      if (uVar1 * -0x5555555555555555 < 0x5555555555555556) goto LAB_0014a156;
      bVar9 = true;
      if (uVar1 == 5) goto LAB_0014a158;
    }
    bVar9 = 0x3333333333333333 < uVar1 * -0x3333333333333333;
  }
LAB_0014a158:
  return (bool_t)bVar9;
}

Assistant:

bool_t priRMTest(const word a[], size_t n, size_t iter, void* stack)
{
	register size_t s;
	register size_t m;
	register size_t i;
	// переменные в stack
	word* r = (word*)stack;
	word* base = r + n;
	qr_o* qr = (qr_o*)(base + n);
	octet* combo_state = (octet*)qr + zmCreate_keep(O_OF_W(n));
	stack = combo_state + prngCOMBO_keep();
	// pre
	ASSERT(wwIsValid(a, n));
	// нормализация
	n = wwWordSize(a, n);
	// четное?
	if (zzIsEven(a, n))
		return wwCmpW(a, n, 2) == 0;
	// маленькое?
	if (n == 1 && a[0] < 49)
		return a[0] != 1 && (a[0] == 3 || a[0] % 3) && (a[0] == 5 || a[0] % 5);
	// подготовить генератор
	prngCOMBOStart(combo_state, utilNonce32());
	// создать кольцо
	wwTo(base, O_OF_W(n), a);
	zmCreate(qr, (octet*)base, memNonZeroSize(base, O_OF_W(n)), stack);
	// a - 1 = r 2^s (r -- нечетное)
	wwCopy(r, a, n);
	zzSubW2(r, n, 1);
	s = wwLoZeroBits(r, n);
	wwShLo(r, n, s);
	m = wwWordSize(r, n);
	// итерации
	while (iter--)
	{
		// base <-R {1, \ldots, a - 1} \ {\pm one}
		i = 0;
		do
			if (i++ * 45 > B_PER_IMPOSSIBLE * 10 || 
				!zzRandNZMod(base, a, n, prngCOMBOStepR, combo_state))
			{
				s = m = 0;
				return FALSE;
			}
		while (wwEq(base, qr->unity, n) || zzIsSumEq(a, base, qr->unity, n));
		// base <- base^r \mod a
		qrPower(base, base, r, m, qr, stack);
		// base == \pm one => тест пройден
		if (wwEq(base, qr->unity, n) || zzIsSumEq(a, base, qr->unity, n))
			continue;
		// base^{2^i} \equiv -1 \mod a?
		for (i = 1; i < s; ++i)
		{
			qrSqr(base, base, qr, stack);
			if (wwEq(base, qr->unity, n))
			{
				s = m = i = 0;
				return FALSE;
			}
			if (zzIsSumEq(a, base, qr->unity, n))
				break;
		}
		if (i == s)
		{
			s = m = i = 0;
			return FALSE;
		}
	}
	s = m = i = 0;
	// простое
	return TRUE;
}